

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

int __thiscall FixedSizeCache<int>::max(FixedSizeCache<int> *this)

{
  int iVar1;
  long lVar2;
  runtime_error *this_00;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = this->_count;
  if ((long)iVar5 != 0) {
    piVar3 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar5 != 1) {
      lVar2 = (long)iVar5 * 4 + -4;
      iVar5 = *piVar3;
      piVar4 = piVar3;
      do {
        piVar4 = piVar4 + 1;
        iVar1 = *piVar4;
        iVar6 = iVar5;
        if (iVar5 <= iVar1) {
          iVar6 = iVar1;
        }
        if (iVar5 < iVar1) {
          piVar3 = piVar4;
        }
        lVar2 = lVar2 + -4;
        iVar5 = iVar6;
      } while (lVar2 != 0);
    }
    return *piVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"FixedSizeCache::max() called on empty cache");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }